

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O2

int __thiscall fmt::v5::file::dup2(file *this,int __fd,int __fd2)

{
  int iVar1;
  int *piVar2;
  system_error *this_00;
  string_view message;
  int fd_local;
  
  do {
    iVar1 = ::dup2(this->fd_,__fd);
    if (iVar1 != -1) {
      return iVar1;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  this_00 = (system_error *)__cxa_allocate_exception(0x18);
  message.size_ = 0x29;
  message.data_ = "cannot duplicate file descriptor {} to {}";
  system_error::system_error<int,int>(this_00,*piVar2,message,&this->fd_,&fd_local);
  __cxa_throw(this_00,&system_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void file::dup2(int fd) {
  int result = 0;
  FMT_RETRY(result, FMT_POSIX_CALL(dup2(fd_, fd)));
  if (result == -1) {
    FMT_THROW(system_error(errno,
      "cannot duplicate file descriptor {} to {}", fd_, fd));
  }
}